

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::addRowsInterface
          (Highs *this,HighsInt ext_num_new_row,double *ext_row_lower,double *ext_row_upper,
          HighsInt ext_num_new_nz,HighsInt *ext_ar_start,HighsInt *ext_ar_index,double *ext_ar_value
          )

{
  HighsInt *pHVar1;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar2;
  int iVar3;
  HighsInt bound_scale;
  pointer pdVar4;
  undefined1 auVar5 [16];
  pointer piVar6;
  Highs *this_00;
  bool bVar7;
  HighsStatus HVar8;
  ulong uVar9;
  ulong uVar10;
  HighsStatus HVar11;
  size_type __new_size;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  vector<double,_std::allocator<double>_> local_rowUpper;
  vector<double,_std::allocator<double>_> local_rowLower;
  allocator_type local_2f9;
  string local_2f8;
  HighsLp *local_2d8;
  HighsLogOptions *local_2d0;
  HighsStatus local_2c4;
  ulong local_2c0;
  HighsInt *local_2b8;
  vector<double,_std::allocator<double>_> local_2b0;
  vector<double,_std::allocator<double>_> local_298;
  undefined1 local_280 [16];
  vector<int,_std::allocator<int>_> local_270;
  pointer local_258;
  pointer local_240;
  pointer piStack_238;
  pointer local_230;
  pointer local_228;
  pointer pdStack_220;
  pointer local_218;
  long local_210;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_208;
  Highs *local_200;
  HighsIndexCollection local_1f8;
  string local_1a8;
  string local_188;
  HighsLogOptions local_168;
  HighsLogOptions local_108;
  HighsSparseMatrix local_a0;
  long lVar16;
  
  if ((ext_num_new_nz | ext_num_new_row) < 0) {
    return kError;
  }
  if (ext_num_new_row == 0) {
    return kOk;
  }
  local_2d0 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_2b8 = ext_ar_start;
  bVar7 = isRowDataNull(local_2d0,ext_row_lower,ext_row_upper);
  if (bVar7) {
    return kError;
  }
  if (ext_num_new_nz != 0) {
    bVar7 = isMatrixDataNull(local_2d0,local_2b8,ext_ar_index,ext_ar_value);
    if (bVar7) {
      return kError;
    }
    if ((this->model_).lp_.num_col_ < 1) {
      return kError;
    }
  }
  local_2d8 = &(this->model_).lp_;
  iVar3 = (this->model_).lp_.num_row_;
  local_1f8.is_set_ = false;
  local_1f8.set_num_entries_ = -1;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_1f8._41_8_ = 0;
  local_1f8.is_interval_ = true;
  local_1f8.from_ = 0;
  local_1f8.to_ = ext_num_new_row + -1;
  uVar10 = (ulong)(uint)ext_num_new_row;
  local_200 = this;
  local_1f8.dimension_ = ext_num_new_row;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_298,ext_row_lower,
             ext_row_lower + uVar10,(allocator_type *)local_280);
  local_2c0 = uVar10;
  local_210 = (long)iVar3;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_2b0,ext_row_upper,
             ext_row_upper + uVar10,(allocator_type *)local_280);
  this_00 = local_200;
  local_108.log_stream = local_2d0->log_stream;
  local_108.output_flag = local_2d0->output_flag;
  local_108.log_to_console = local_2d0->log_to_console;
  local_108.log_dev_level = local_2d0->log_dev_level;
  local_108.user_log_callback = local_2d0->user_log_callback;
  local_108.user_log_callback_data = local_2d0->user_log_callback_data;
  pfVar2 = &local_108.user_callback;
  local_208 = &(local_200->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar2,local_208);
  local_108.user_callback_active =
       (this_00->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_108.user_callback_data =
       (this_00->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar8 = assessBounds(&this_00->options_,"Row",(this_00->model_).lp_.num_row_,&local_1f8,&local_298
                       ,&local_2b0,(this_00->options_).super_HighsOptionsStruct.infinite_bound,
                       (HighsVarType *)0x0);
  local_280._0_8_ = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"assessBounds","");
  HVar8 = interpretCallStatus(&local_108,HVar8,kOk,(string *)local_280);
  if ((vector<int,_std::allocator<int>_> *)local_280._0_8_ != &local_270) {
    operator_delete((void *)local_280._0_8_);
  }
  uVar10 = local_2c0;
  if (local_108.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  HVar11 = kError;
  if (HVar8 == kError) goto LAB_0022d706;
  bound_scale = (this_00->model_).lp_.user_bound_scale_;
  if (bound_scale != 0) {
    bVar7 = boundScaleOk(&local_298,&local_2b0,bound_scale,
                         (this_00->options_).super_HighsOptionsStruct.infinite_bound);
    if (!bVar7) {
      highsLogUser(local_2d0,kError,"User bound scaling yields infinite bound\n");
      goto LAB_0022d706;
    }
    dVar13 = ldexp(1.0,(this_00->model_).lp_.user_bound_scale_);
    if (0 < ext_num_new_row) {
      uVar9 = 0;
      do {
        local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] * dVar13;
        local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] =
             local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] * dVar13;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
  }
  appendRowsToLpVectors(local_2d8,ext_num_new_row,&local_298,&local_2b0);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_280);
  local_280._4_4_ = ((HighsLp *)&local_2d8->num_col_)->num_col_;
  local_280._0_4_ = 2;
  local_280._8_4_ = ext_num_new_row;
  if (ext_num_new_nz == 0) {
    local_2f8._M_dataplus._M_p = local_2f8._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&local_270,(ulong)(ext_num_new_row + 1),(value_type_conflict2 *)&local_2f8);
LAB_0022d4da:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,(HighsSparseMatrix *)local_280);
    HighsSparseMatrix::addRows(&(this_00->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((this_00->model_).lp_.scale_.has_scaling == true) {
      __new_size = local_210 + ext_num_new_row;
      std::vector<double,_std::allocator<double>_>::resize
                (&(this_00->model_).lp_.scale_.row,__new_size);
      auVar5 = _DAT_003beea0;
      if (0 < ext_num_new_row) {
        iVar3 = (this_00->model_).lp_.num_row_;
        pdVar4 = (this_00->model_).lp_.scale_.row.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar12 = uVar10 - 1;
        auVar14._8_4_ = (int)lVar12;
        auVar14._0_8_ = lVar12;
        auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar12 = 0;
        auVar14 = auVar14 ^ _DAT_003beea0;
        auVar15 = _DAT_003bee90;
        do {
          auVar17 = auVar15 ^ auVar5;
          if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                      auVar14._4_4_ < auVar17._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar4 + lVar12 + (long)iVar3 * 8) = 0x3ff0000000000000;
          }
          if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
              auVar17._12_4_ <= auVar14._12_4_) {
            *(undefined8 *)((long)pdVar4 + lVar12 + (long)iVar3 * 8 + 8) = 0x3ff0000000000000;
          }
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar16 + 2;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)((int)uVar10 + 1U >> 1) << 4 != lVar12);
      }
      (this_00->model_).lp_.scale_.num_row = (HighsInt)__new_size;
      HighsSparseMatrix::applyColScale((HighsSparseMatrix *)local_280,&(this_00->model_).lp_.scale_)
      ;
      HighsSparseMatrix::considerRowScaling
                ((HighsSparseMatrix *)local_280,
                 (this_00->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (this_00->model_).lp_.scale_.row.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + (this_00->model_).lp_.num_row_);
    }
    if ((this_00->basis_).useful == true) {
      appendBasicRowsToBasisInterface(this_00,ext_num_new_row);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
    HighsLp::addRowNames(local_2d8,&local_1a8,ext_num_new_row);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    pHVar1 = &(this_00->model_).lp_.num_row_;
    *pHVar1 = *pHVar1 + ext_num_new_row;
    invalidateModelStatusSolutionAndInfo(this_00);
    HEkk::addRows(&this_00->ekk_instance_,local_2d8,(HighsSparseMatrix *)local_280);
  }
  else {
    local_2c4 = HVar8;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2f8,local_2b8,local_2b8 + uVar10,&local_2f9
              );
    piVar6 = local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_2f8._M_dataplus._M_p;
    local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_2f8._M_string_length;
    local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_2f8.field_2._M_allocated_capacity;
    local_2f8._M_dataplus._M_p = (pointer)0x0;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_allocated_capacity = 0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)piVar6 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (operator_delete(piVar6), (pointer)local_2f8._M_dataplus._M_p != (pointer)0x0))
    {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_270,(ulong)(ext_num_new_row + 1));
    *(HighsInt *)
     ((long)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + uVar10 * 4) = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_2f8,ext_ar_index,
               ext_ar_index + (uint)ext_num_new_nz,&local_2f9);
    piVar6 = local_240;
    local_240 = (pointer)local_2f8._M_dataplus._M_p;
    piStack_238 = (pointer)local_2f8._M_string_length;
    local_230 = (pointer)local_2f8.field_2._M_allocated_capacity;
    local_2f8._M_dataplus._M_p = (pointer)0x0;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_allocated_capacity = 0;
    if ((piVar6 != (pointer)0x0) &&
       (operator_delete(piVar6), (pointer)local_2f8._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_2f8,ext_ar_value,
               ext_ar_value + (uint)ext_num_new_nz,(allocator_type *)&local_2f9);
    pdVar4 = local_228;
    local_228 = (pointer)local_2f8._M_dataplus._M_p;
    pdStack_220 = (pointer)local_2f8._M_string_length;
    local_218 = (pointer)local_2f8.field_2._M_allocated_capacity;
    local_2f8._M_dataplus._M_p = (pointer)0x0;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_allocated_capacity = 0;
    if ((pdVar4 != (pointer)0x0) &&
       (operator_delete(pdVar4), local_2f8._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    local_168.log_stream = local_2d0->log_stream;
    local_168.output_flag = local_2d0->output_flag;
    local_168.log_to_console = local_2d0->log_to_console;
    local_168.log_dev_level = local_2d0->log_dev_level;
    local_168.user_log_callback = local_2d0->user_log_callback;
    local_168.user_log_callback_data = local_2d0->user_log_callback_data;
    pfVar2 = &local_168.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar2,local_208);
    local_168.user_callback_active =
         (this_00->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_168.user_callback_data =
         (this_00->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"LP","");
    HVar8 = HighsSparseMatrix::assess
                      ((HighsSparseMatrix *)local_280,local_2d0,&local_188,
                       (this_00->options_).super_HighsOptionsStruct.small_matrix_value,
                       (this_00->options_).super_HighsOptionsStruct.large_matrix_value);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"assessMatrix","");
    HVar8 = interpretCallStatus(&local_168,HVar8,local_2c4,&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    uVar10 = local_2c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    if (local_168.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_168.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (HVar8 != kError) goto LAB_0022d4da;
    HVar8 = kError;
  }
  if (local_228 != (pointer)0x0) {
    operator_delete(local_228);
  }
  if (local_240 != (pointer)0x0) {
    operator_delete(local_240);
  }
  if (local_258 != (pointer)0x0) {
    operator_delete(local_258);
  }
  HVar11 = HVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_270.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0022d706:
  if (local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar11;
}

Assistant:

HighsStatus Highs::addRowsInterface(HighsInt ext_num_new_row,
                                    const double* ext_row_lower,
                                    const double* ext_row_upper,
                                    HighsInt ext_num_new_nz,
                                    const HighsInt* ext_ar_start,
                                    const HighsInt* ext_ar_index,
                                    const double* ext_ar_value) {
  // addRows is fundamentally different from addCols, since the new
  // matrix data are held row-wise, so we have to insert data into the
  // column-wise matrix of the LP.
  if (kExtendInvertWhenAddingRows) {
    if (ekk_instance_.status_.has_nla)
      ekk_instance_.debugNlaCheckInvert("Start of Highs::addRowsInterface",
                                        kHighsDebugLevelExpensive + 1);
  }
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_row < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_row == 0) return HighsStatus::kOk;
  if (ext_num_new_row > 0)
    if (isRowDataNull(options.log_options, ext_row_lower, ext_row_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_ar_start, ext_ar_index,
                         ext_ar_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;

  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of columns
  if (lp.num_col_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of rows
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_row;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_row - 1;
  // Take a copy of the bounds that can be normalised
  std::vector<double> local_rowLower{ext_row_lower,
                                     ext_row_lower + ext_num_new_row};
  std::vector<double> local_rowUpper{ext_row_upper,
                                     ext_row_upper + ext_num_new_row};

  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Row", lp.num_row_, index_collection,
                   local_rowLower, local_rowUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_rowLower, local_rowUpper, lp.user_bound_scale_,
                      options_.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++) {
      local_rowLower[iRow] *= bound_scale_value;
      local_rowUpper[iRow] *= bound_scale_value;
    }
  }

  // Append the rows to the LP vectors
  appendRowsToLpVectors(lp, ext_num_new_row, local_rowLower, local_rowUpper);

  // Form a row-wise HighsSparseMatrix of the new matrix rows so that
  // is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_ar_matrix;
  local_ar_matrix.num_col_ = lp.num_col_;
  local_ar_matrix.num_row_ = ext_num_new_row;
  local_ar_matrix.format_ = MatrixFormat::kRowwise;
  if (ext_num_new_nz) {
    local_ar_matrix.start_ = {ext_ar_start, ext_ar_start + ext_num_new_row};
    local_ar_matrix.start_.resize(ext_num_new_row + 1);
    local_ar_matrix.start_[ext_num_new_row] = ext_num_new_nz;
    local_ar_matrix.index_ = {ext_ar_index, ext_ar_index + ext_num_new_nz};
    local_ar_matrix.value_ = {ext_ar_value, ext_ar_value + ext_num_new_nz};
    // Assess the matrix columns
    return_status =
        interpretCallStatus(options_.log_options,
                            local_ar_matrix.assess(options.log_options, "LP",
                                                   options.small_matrix_value,
                                                   options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is row-wise or
    // column-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty row-wise HighsSparseMatrix of the new matrix
    // rows
    local_ar_matrix.start_.assign(ext_num_new_row + 1, 0);
  }
  // Append the rows to LP matrix
  lp.a_matrix_.addRows(local_ar_matrix);
  if (lp_has_scaling) {
    // Extend the row scaling factors
    scale.row.resize(newNumRow);
    for (HighsInt iRow = 0; iRow < ext_num_new_row; iRow++)
      scale.row[lp.num_row_ + iRow] = 1.0;
    scale.num_row = newNumRow;
    // Apply the existing column scaling to the new rows
    local_ar_matrix.applyColScale(scale);
    // Consider applying row scaling to the new rows.
    local_ar_matrix.considerRowScaling(options.allowed_matrix_scale_factor,
                                       &scale.row[lp.num_row_]);
  }
  // Update the basis corresponding to new basic rows
  if (useful_basis) appendBasicRowsToBasisInterface(ext_num_new_row);

  // Possibly add row names
  lp.addRowNames("", ext_num_new_row);

  // Increase the number of rows in the LP
  lp.num_row_ += ext_num_new_row;
  assert(lpDimensionsOk("addRows", lp, options.log_options));

  // Deduce the consequences of adding new rows
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.addRows(lp, local_ar_matrix);

  return return_status;
}